

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetpos.c
# Opt level: O3

int main(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  fpos_t pos2;
  fpos_t pos1;
  fpos_t fStack_28;
  fpos_t local_18;
  
  __stream = tmpfile();
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x25,"( fh = tmpfile() ) != NULL");
  }
  iVar1 = fgetpos(__stream,&local_18);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x26,"fgetpos( fh, &pos1 ) == 0");
  }
  sVar2 = fwrite("1234567890\nABCDEFGHIJKLMNOPQRSTUVWXYZ\nabcdefghijklmnopqrstuvwxyz\n",1,0x41,
                 __stream);
  if (sVar2 != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x27,"fwrite( teststring, 1, strlen( teststring ), fh ) == strlen( teststring )");
  }
  iVar1 = fgetpos(__stream,&fStack_28);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x28,"fgetpos( fh, &pos2 ) == 0");
  }
  iVar1 = fsetpos(__stream,&local_18);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x29,"fsetpos( fh, &pos1 ) == 0");
  }
  lVar3 = ftell(__stream);
  if (lVar3 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x2a,"ftell( fh ) == 0");
  }
  iVar1 = fsetpos(__stream,&fStack_28);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x2b,"fsetpos( fh, &pos2 ) == 0");
  }
  lVar3 = ftell(__stream);
  if (lVar3 != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x2c,"( size_t )ftell( fh ) == strlen( teststring )");
  }
  iVar1 = fclose(__stream);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fgetpos.c, line %d - %s\n"
           ,0x2d,"fclose( fh ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
    fpos_t pos1, pos2;
    TESTCASE( ( fh = tmpfile() ) != NULL );
    TESTCASE( fgetpos( fh, &pos1 ) == 0 );
    TESTCASE( fwrite( teststring, 1, strlen( teststring ), fh ) == strlen( teststring ) );
    TESTCASE( fgetpos( fh, &pos2 ) == 0 );
    TESTCASE( fsetpos( fh, &pos1 ) == 0 );
    TESTCASE( ftell( fh ) == 0 );
    TESTCASE( fsetpos( fh, &pos2 ) == 0 );
    TESTCASE( ( size_t )ftell( fh ) == strlen( teststring ) );
    TESTCASE( fclose( fh ) == 0 );
    return TEST_RESULTS;
}